

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::set(Solver *this,char *arg,int val)

{
  bool bVar1;
  int iVar2;
  State *pSVar3;
  uint in_EDX;
  Solver *in_RSI;
  Options *in_RDI;
  bool res;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  Options *this_00;
  
  this_00 = in_RDI;
  if ((*(Internal **)&in_RDI->__start_of_options__ != (Internal *)0x0) &&
     (*(FILE **)&in_RDI->block != (FILE *)0x0)) {
    trace_api_call(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(char *)in_RDI,
                   in_stack_ffffffffffffffdc);
  }
  require_solver_pointer_to_be_non_zero
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (char *)0xe1f644);
  if (*(External **)&in_RDI->arenacompact == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (*(Internal **)&in_RDI->__start_of_options__ == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar3 = state((Solver *)in_RDI);
  if ((*pSVar3 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  iVar2 = strcmp(&in_RSI->adding_clause,"log");
  if ((((iVar2 != 0) && (iVar2 = strcmp(&in_RSI->adding_clause,"quiet"), iVar2 != 0)) &&
      (iVar2 = strcmp(&in_RSI->adding_clause,"report"), iVar2 != 0)) &&
     ((iVar2 = strcmp(&in_RSI->adding_clause,"verbose"), iVar2 != 0 &&
      (pSVar3 = state((Solver *)in_RDI), *pSVar3 != CONFIGURING)))) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"can only set option \'set (\"%s\", %d)\' right after initialization",in_RSI,
            (ulong)in_EDX);
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  bVar1 = Options::set(this_00,&in_RSI->adding_clause,in_EDX);
  return bVar1;
}

Assistant:

bool Solver::set (const char *arg, int val) {
  TRACE ("set", arg, val);
  REQUIRE_VALID_STATE ();
  if (strcmp (arg, "log") && strcmp (arg, "quiet") &&
      strcmp (arg, "report") && strcmp (arg, "verbose")) {
    REQUIRE (
        state () == CONFIGURING,
        "can only set option 'set (\"%s\", %d)' right after initialization",
        arg, val);
  }
  bool res = internal->opts.set (arg, val);
  LOG_API_CALL_END ("set", arg, val, res);

  return res;
}